

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_inquisitor.cpp
# Opt level: O0

int AF_A_InquisitorAttack(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AActor *self_00;
  DObject *this;
  AActor *pAVar1;
  PClassActor *pPVar2;
  bool bVar3;
  double dVar4;
  bool local_5e;
  bool local_5b;
  AActor *proj;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_inquisitor.cpp"
                  ,0x37,"int AF_A_InquisitorAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                 );
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar3) {
    self_00 = *(AActor **)&param->field_0;
    local_5b = true;
    if (self_00 != (AActor *)0x0) {
      local_5b = DObject::IsKindOf((DObject *)self_00,AActor::RegistrationInfo.MyClass);
    }
    if (local_5b != false) {
      if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
        bVar3 = false;
        if ((param[1].field_0.field_3.Type == '\x03') &&
           (bVar3 = true, param[1].field_0.field_1.atag != 1)) {
          bVar3 = param[1].field_0.field_1.a == (void *)0x0;
        }
        if (!bVar3) {
          __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_inquisitor.cpp"
                        ,0x37,
                        "int AF_A_InquisitorAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                       );
        }
        this = (DObject *)param[1].field_0.field_1.a;
        local_5e = true;
        if (this != (DObject *)0x0) {
          local_5e = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
        }
        if (local_5e == false) {
          __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_inquisitor.cpp"
                        ,0x37,
                        "int AF_A_InquisitorAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                       );
        }
      }
      if ((2 < numparam) && (param[2].field_0.field_3.Type != 0xff)) {
        bVar3 = false;
        if ((param[2].field_0.field_3.Type == '\x03') &&
           (bVar3 = true, param[2].field_0.field_1.atag != 8)) {
          bVar3 = param[2].field_0.field_1.a == (void *)0x0;
        }
        if (!bVar3) {
          __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_inquisitor.cpp"
                        ,0x37,
                        "int AF_A_InquisitorAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                       );
        }
      }
      bVar3 = TObjPtr<AActor>::operator==(&self_00->target,(AActor *)0x0);
      if (!bVar3) {
        A_FaceTarget(self_00);
        AActor::AddZ(self_00,32.0,true);
        TAngle<double>::operator-=(&(self_00->Angles).Yaw,1.40625);
        dVar4 = AActor::Z(self_00);
        pAVar1 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&self_00->target);
        pPVar2 = PClass::FindActor("InquisitorShot");
        pAVar1 = P_SpawnMissileZAimed(self_00,dVar4,pAVar1,pPVar2);
        if (pAVar1 != (AActor *)0x0) {
          (pAVar1->Vel).Z = (pAVar1->Vel).Z + 9.0;
        }
        TAngle<double>::operator+=(&(self_00->Angles).Yaw,2.8125);
        dVar4 = AActor::Z(self_00);
        pAVar1 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&self_00->target);
        pPVar2 = PClass::FindActor("InquisitorShot");
        pAVar1 = P_SpawnMissileZAimed(self_00,dVar4,pAVar1,pPVar2);
        if (pAVar1 != (AActor *)0x0) {
          (pAVar1->Vel).Z = (pAVar1->Vel).Z + 16.0;
        }
        AActor::AddZ(self_00,-32.0,true);
      }
      return 0;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_inquisitor.cpp"
                  ,0x37,"int AF_A_InquisitorAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                 );
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_inquisitor.cpp"
                ,0x37,"int AF_A_InquisitorAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_InquisitorAttack)
{
	PARAM_ACTION_PROLOGUE;

	AActor *proj;

	if (self->target == NULL)
		return 0;

	A_FaceTarget (self);

	self->AddZ(32);
	self->Angles.Yaw -= 45./32;
	proj = P_SpawnMissileZAimed (self, self->Z(), self->target, PClass::FindActor("InquisitorShot"));
	if (proj != NULL)
	{
		proj->Vel.Z += 9;
	}
	self->Angles.Yaw += 45./16;
	proj = P_SpawnMissileZAimed (self, self->Z(), self->target, PClass::FindActor("InquisitorShot"));
	if (proj != NULL)
	{
		proj->Vel.Z += 16;
	}
	self->AddZ(-32);
	return 0;
}